

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_operate.c
# Opt level: O0

CURLcode check_finished(parastate *s)

{
  undefined8 uVar1;
  _Bool _Var2;
  CURLcode CVar3;
  time_t tVar4;
  long local_70;
  CURLcode tres_1;
  time_t tock;
  CURLcode tres;
  CURL *easy;
  per_transfer *ended;
  long delay;
  GlobalConfig *pGStack_30;
  _Bool retry;
  GlobalConfig *global;
  long lStack_20;
  _Bool checkmore;
  CURLMsg *msg;
  int rc;
  CURLcode result;
  parastate *s_local;
  
  msg._4_4_ = CURLE_OK;
  global._7_1_ = 0;
  pGStack_30 = s->global;
  _rc = s;
  progress_meter(pGStack_30,&s->start,false);
  do {
    lStack_20 = curl_multi_info_read(_rc->multi,&msg);
    if (lStack_20 != 0) {
      uVar1 = *(undefined8 *)(lStack_20 + 8);
      CVar3 = *(CURLcode *)(lStack_20 + 0x10);
      curl_easy_getinfo(uVar1,0x100015,&easy);
      curl_multi_remove_handle(_rc->multi,uVar1);
      if ((((*(byte *)((long)easy + 0x1d8) >> 4 & 1) != 0) && (CVar3 == CURLE_ABORTED_BY_CALLBACK))
         && (*(long *)((long)easy + 0x1d0) != 0)) {
        curl_msnprintf(*(undefined8 *)((long)easy + 0x1d0),0x100,
                       "Transfer aborted due to critical error in another transfer");
      }
      CVar3 = post_per_transfer(pGStack_30,(per_transfer *)easy,CVar3,(_Bool *)((long)&delay + 7),
                                (long *)&ended);
      progress_finalize((per_transfer *)easy);
      all_added = all_added + -1;
      global._7_1_ = 1;
      if ((delay._7_1_ & 1) == 0) {
        if ((CVar3 != CURLE_OK) &&
           (((*(byte *)((long)easy + 0x1d8) >> 4 & 1) == 0 || (msg._4_4_ == CURLE_OK)))) {
          msg._4_4_ = CVar3;
        }
        _Var2 = is_fatal_error(msg._4_4_);
        if ((_Var2) ||
           ((msg._4_4_ != CURLE_OK && ((*(ushort *)&pGStack_30->field_0x63 >> 2 & 1) != 0)))) {
          _rc->wrapitup = true;
        }
        del_per_transfer((per_transfer *)easy);
      }
      else {
        *(byte *)((long)easy + 0x1d8) = *(byte *)((long)easy + 0x1d8) & 0xf7;
        if (ended == (per_transfer *)0x0) {
          local_70 = 0;
        }
        else {
          tVar4 = time((time_t *)0x0);
          local_70 = tVar4 + (long)ended / 1000;
        }
        *(long *)((long)easy + 0x188) = local_70;
      }
    }
  } while (lStack_20 != 0);
  if ((_rc->wrapitup & 1U) == 0) {
    if (((global._7_1_ & 1) == 0) && (tVar4 = time((time_t *)0x0), _rc->tick != tVar4)) {
      global._7_1_ = 1;
      _rc->tick = tVar4;
    }
    if ((global._7_1_ & 1) != 0) {
      CVar3 = add_parallel_transfers
                        (pGStack_30,_rc->multi,_rc->share,&_rc->more_transfers,&_rc->added_transfers
                        );
      if (CVar3 != CURLE_OK) {
        msg._4_4_ = CVar3;
      }
      if ((_rc->added_transfers & 1U) != 0) {
        _rc->still_running = 1;
      }
    }
    _Var2 = is_fatal_error(msg._4_4_);
    if ((_Var2) || ((msg._4_4_ != CURLE_OK && ((*(ushort *)&pGStack_30->field_0x63 >> 2 & 1) != 0)))
       ) {
      _rc->wrapitup = true;
    }
  }
  return msg._4_4_;
}

Assistant:

static CURLcode check_finished(struct parastate *s)
{
  CURLcode result = CURLE_OK;
  int rc;
  CURLMsg *msg;
  bool checkmore = FALSE;
  struct GlobalConfig *global = s->global;
  progress_meter(global, &s->start, FALSE);
  do {
    msg = curl_multi_info_read(s->multi, &rc);
    if(msg) {
      bool retry;
      long delay;
      struct per_transfer *ended;
      CURL *easy = msg->easy_handle;
      CURLcode tres = msg->data.result;
      curl_easy_getinfo(easy, CURLINFO_PRIVATE, (void *)&ended);
      curl_multi_remove_handle(s->multi, easy);

      if(ended->abort && (tres == CURLE_ABORTED_BY_CALLBACK) &&
         ended->errorbuffer) {
        msnprintf(ended->errorbuffer, CURL_ERROR_SIZE,
                  "Transfer aborted due to critical error "
                  "in another transfer");
      }
      tres = post_per_transfer(global, ended, tres, &retry, &delay);
      progress_finalize(ended); /* before it goes away */
      all_added--; /* one fewer added */
      checkmore = TRUE;
      if(retry) {
        ended->added = FALSE; /* add it again */
        /* we delay retries in full integer seconds only */
        ended->startat = delay ? time(NULL) + delay/1000 : 0;
      }
      else {
        /* result receives this transfer's error unless the transfer was
           marked for abort due to a critical error in another transfer */
        if(tres && (!ended->abort || !result))
          result = tres;
        if(is_fatal_error(result) || (result && global->fail_early))
          s->wrapitup = TRUE;
        (void)del_per_transfer(ended);
      }
    }
  } while(msg);
  if(!s->wrapitup) {
    if(!checkmore) {
      time_t tock = time(NULL);
      if(s->tick != tock) {
        checkmore = TRUE;
        s->tick = tock;
      }
    }
    if(checkmore) {
      /* one or more transfers completed, add more! */
      CURLcode tres = add_parallel_transfers(global, s->multi, s->share,
                                             &s->more_transfers,
                                             &s->added_transfers);
      if(tres)
        result = tres;
      if(s->added_transfers)
        /* we added new ones, make sure the loop does not exit yet */
        s->still_running = 1;
    }
    if(is_fatal_error(result) || (result && global->fail_early))
      s->wrapitup = TRUE;
  }
  return result;
}